

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O3

bool __thiscall QSqlCachedResult::fetch(QSqlCachedResult *this,int i)

{
  int iVar1;
  QSqlResultPrivate *pQVar2;
  bool bVar3;
  int iVar4;
  
  pQVar2 = (this->super_QSqlResult).d_ptr;
  bVar3 = QSqlResult::isActive(&this->super_QSqlResult);
  if (i < 0 || !bVar3) {
LAB_0011728a:
    bVar3 = false;
  }
  else {
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if (iVar4 == i) {
      return true;
    }
    if (pQVar2->forwardOnly == true) {
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      if ((i < iVar4) || (iVar4 = QSqlResult::at(&this->super_QSqlResult), iVar4 == -2))
      goto LAB_0011728a;
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      if (iVar4 < i + -1) {
        do {
          iVar4 = (*(this->super_QSqlResult)._vptr_QSqlResult[0x1f])(this,pQVar2 + 1,0xffffffff);
          if ((char)iVar4 == '\0') goto LAB_0011728a;
          iVar4 = QSqlResult::at(&this->super_QSqlResult);
          (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(iVar4 + 1));
          iVar4 = QSqlResult::at(&this->super_QSqlResult);
        } while (iVar4 < i + -1);
      }
      iVar4 = (*(this->super_QSqlResult)._vptr_QSqlResult[0x1f])(this,pQVar2 + 1,0);
      if ((char)iVar4 == '\0') {
        return false;
      }
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      i = iVar4 + 1;
    }
    else {
      iVar4 = *(int *)&pQVar2[1].sqldriver.wp.value;
      iVar1 = *(int *)((long)&pQVar2[1].sqldriver.wp.value + 4);
      if (iVar4 < iVar1 * (i + 1)) {
        if (0 < iVar4) {
          (*(this->super_QSqlResult)._vptr_QSqlResult[3])
                    (this,(long)iVar4 / (long)iVar1 & 0xffffffff,
                     (long)iVar4 % (long)iVar1 & 0xffffffff);
        }
        do {
          iVar4 = QSqlResult::at(&this->super_QSqlResult);
          if (i < iVar4) goto LAB_00117297;
          bVar3 = cacheNext(this);
        } while (bVar3);
        if ((pQVar2->forwardOnly != false) ||
           (*(int *)&pQVar2[1].sqldriver.wp.value <
            (i + 1) * *(int *)((long)&pQVar2[1].sqldriver.wp.value + 4))) goto LAB_0011728a;
      }
    }
LAB_00117297:
    (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(uint)i);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool QSqlCachedResult::fetch(int i)
{
    Q_D(QSqlCachedResult);
    if ((!isActive()) || (i < 0))
        return false;
    if (at() == i)
        return true;
    if (d->forwardOnly) {
        // speed hack - do not copy values if not needed
        if (at() > i || at() == QSql::AfterLastRow)
            return false;
        while(at() < i - 1) {
            if (!gotoNext(d->cache, -1))
                return false;
            setAt(at() + 1);
        }
        if (!gotoNext(d->cache, 0))
            return false;
        setAt(at() + 1);
        return true;
    }
    if (d->canSeek(i)) {
        setAt(i);
        return true;
    }
    if (d->rowCacheEnd > 0)
        setAt(d->cacheCount());
    while (at() < i + 1) {
        if (!cacheNext()) {
            if (d->canSeek(i))
                break;
            return false;
        }
    }
    setAt(i);

    return true;
}